

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O2

string * __thiscall
re2c::InputAPI::stmt_backupctx_abi_cxx11_
          (string *__return_storage_ptr__,InputAPI *this,uint32_t ind)

{
  opt_t *poVar1;
  uint32_t extraout_EDX;
  uint32_t ind_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = &bStack_78;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  if (this->type_ == CUSTOM) {
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    std::operator+(&local_58,&poVar1->yybackupctx," ()");
    this_00 = &local_58;
    std::__cxx11::string::operator=((string *)&local_38,(string *)this_00);
  }
  else {
    ind_00 = ind;
    if (this->type_ != DEFAULT) goto LAB_0012c7bb;
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    std::operator+(&bStack_78,&poVar1->yyctxmarker," = ");
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    std::operator+(&local_58,&bStack_78,&poVar1->yycursor);
    std::__cxx11::string::operator=((string *)&local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::~string((string *)this_00);
  ind_00 = extraout_EDX;
LAB_0012c7bb:
  indent_abi_cxx11_(&bStack_78,(re2c *)(ulong)ind,ind_00);
  std::operator+(&local_58,&bStack_78,&local_38);
  std::operator+(__return_storage_ptr__,&local_58,";\n");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::stmt_backupctx (uint32_t ind) const
{
	std::string s;
	switch (type_)
	{
		case DEFAULT:
			s = opts->yyctxmarker + " = " + opts->yycursor;
			break;
		case CUSTOM:
			s = opts->yybackupctx + " ()";
			break;
	}
	return indent (ind) + s + ";\n";
}